

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> __thiscall
cmm::BinaryOperatorAST::tryFoldBinOpLogic
          (BinaryOperatorAST *this,TokenKind TokenKind,
          unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *LHS,
          unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *RHS)

{
  bool bVar1;
  pointer pEVar2;
  undefined1 local_62;
  undefined1 local_61;
  undefined1 local_29;
  bool Value;
  unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *RHS_local;
  unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *LHS_local;
  TokenKind TokenKind_local;
  
  if (TokenKind == AmpAmp) {
    pEVar2 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::
             operator->(LHS);
    bVar1 = ExpressionAST::asBool(pEVar2);
    local_61 = false;
    if (bVar1) {
      pEVar2 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::
               operator->(RHS);
      local_61 = ExpressionAST::asBool(pEVar2);
    }
    local_29 = local_61;
  }
  else if (TokenKind == PipePipe) {
    pEVar2 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::
             operator->(LHS);
    bVar1 = ExpressionAST::asBool(pEVar2);
    local_62 = true;
    if (!bVar1) {
      pEVar2 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::
               operator->(RHS);
      local_62 = ExpressionAST::asBool(pEVar2);
    }
    local_29 = local_62;
  }
  else {
    local_29 = false;
  }
  pEVar2 = (pointer)operator_new(0x10);
  BoolAST::BoolAST((BoolAST *)pEVar2,local_29);
  std::unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>>::
  unique_ptr<std::default_delete<cmm::ExpressionAST>,void>
            ((unique_ptr<cmm::ExpressionAST,std::default_delete<cmm::ExpressionAST>> *)this,pEVar2);
  return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>)
         (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<ExpressionAST>
BinaryOperatorAST::tryFoldBinOpLogic(Token::TokenKind TokenKind,
                                     std::unique_ptr<ExpressionAST> LHS,
                                     std::unique_ptr<ExpressionAST> RHS) {
  bool Value;

  switch (TokenKind) {
  default:                Value = false; break;
  case Token::AmpAmp:     Value = LHS->asBool() && RHS->asBool(); break;
  case Token::PipePipe:   Value = LHS->asBool() || RHS->asBool(); break;
  }

  return std::unique_ptr<ExpressionAST>(new BoolAST(Value));
}